

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputLayers.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeInputLayers(ConvertLayerParameters layerParameters)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
  *this;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  InputParameter *pIVar4;
  runtime_error *prVar5;
  size_type sVar6;
  string *layerType;
  mapped_type *this_01;
  ostream *poVar7;
  NetParameter *in_stack_00000008;
  allocator local_459;
  string local_458;
  long *local_438;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_430;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_428;
  const_iterator local_420;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_418;
  const_iterator local_410;
  long *local_408;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_400;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_3f8;
  const_iterator local_3f0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_3e8;
  const_iterator local_3e0;
  const_iterator local_3d8;
  long *dim;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedField<long> *__range2;
  string local_3b0 [32];
  stringstream local_390 [8];
  stringstream ss_1;
  ostream local_380 [376];
  undefined1 local_208 [8];
  vector<long,_std::allocator<long>_> dims;
  BlobShape *shape;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
  *local_28;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *caffeNetworkInputNames;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
  *mapBlobNameToDimensions;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  mapBlobNameToDimensions =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
        *)caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  caffeNetworkInputNames =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)layerParameters.mapCaffeLayerNamesToIndex;
  local_28 = layerParameters.mapBlobNameToDimensions;
  psVar3 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mapBlobNameToDimensions);
  bVar1 = std::operator==(psVar3,"Input");
  if (bVar1) {
    pIVar4 = caffe::LayerParameter::input_param((LayerParameter *)mapBlobNameToDimensions);
    iVar2 = caffe::InputParameter::shape_size(pIVar4);
    if (iVar2 == 0) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      poVar7 = std::operator<<(local_1a0,"Invalid caffe model: Input layer \'");
      psVar3 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mapBlobNameToDimensions);
      poVar7 = std::operator<<(poVar7,(string *)psVar3);
      poVar7 = std::operator<<(poVar7,"\' does not specify the shape parameter.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar5,local_1e0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pIVar4 = caffe::LayerParameter::input_param((LayerParameter *)mapBlobNameToDimensions);
    dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)caffe::InputParameter::shape(pIVar4,0);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_208);
    iVar2 = caffe::BlobShape::dim_size
                      ((BlobShape *)
                       dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (iVar2 == 0) {
      std::__cxx11::stringstream::stringstream(local_390);
      poVar7 = std::operator<<(local_380,"Invalid caffe model: Input layer \'");
      psVar3 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mapBlobNameToDimensions);
      poVar7 = std::operator<<(poVar7,(string *)psVar3);
      poVar7 = std::operator<<(poVar7,"\' does not specify dimensions.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      __range2._7_1_ = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar5,local_3b0);
      __range2._7_1_ = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __begin2 = (const_iterator)
               caffe::BlobShape::dim
                         ((BlobShape *)
                          dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    __end2 = google::protobuf::RepeatedField<long>::begin((RepeatedField<long> *)__begin2);
    dim = google::protobuf::RepeatedField<long>::end((RepeatedField<long> *)__begin2);
    for (; __end2 != dim; __end2 = __end2 + 1) {
      local_3d8 = __end2;
      if (*__end2 < 0) {
        __assert_fail("dim >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InputLayers.cpp"
                      ,0x2f,
                      "void CoreMLConverter::convertCaffeInputLayers(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)local_208,__end2);
    }
    sVar6 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)local_208);
    if (sVar6 == 2) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "Ignoring batch/seq size and retaining only the last dimension for conversion. "
                              );
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_3e8._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::begin
                             ((vector<long,_std::allocator<long>_> *)local_208);
      __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
      __normal_iterator<long*>
                ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_3e0
                 ,&local_3e8);
      local_400._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::end
                             ((vector<long,_std::allocator<long>_> *)local_208);
      local_3f8 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator-(&local_400,1);
      __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
      __normal_iterator<long*>
                ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_3f0
                 ,&local_3f8);
      local_408 = (long *)std::vector<long,_std::allocator<long>_>::erase
                                    ((vector<long,_std::allocator<long>_> *)local_208,local_3e0,
                                     local_3f0);
    }
    sVar6 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)local_208);
    if (3 < sVar6) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "Ignoring batch size and retaining only the trailing 3 dimensions for conversion. "
                              );
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_418._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::begin
                             ((vector<long,_std::allocator<long>_> *)local_208);
      __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
      __normal_iterator<long*>
                ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_410
                 ,&local_418);
      local_430._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::end
                             ((vector<long,_std::allocator<long>_> *)local_208);
      local_428 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator-(&local_430,3);
      __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
      __normal_iterator<long*>
                ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_420
                 ,&local_428);
      local_438 = (long *)std::vector<long,_std::allocator<long>_>::erase
                                    ((vector<long,_std::allocator<long>_> *)local_208,local_410,
                                     local_420);
    }
    iVar2 = caffe::LayerParameter::top_size((LayerParameter *)mapBlobNameToDimensions);
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_458,"Caffe layer does not have a top blob ",&local_459);
      psVar3 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mapBlobNameToDimensions);
      layerType = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mapBlobNameToDimensions);
      errorInCaffeProto(&local_458,psVar3,layerType);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
    }
    this_00 = caffeNetworkInputNames;
    psVar3 = caffe::LayerParameter::top_abi_cxx11_((LayerParameter *)mapBlobNameToDimensions,0);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                            *)this_00,psVar3);
    std::vector<long,_std::allocator<long>_>::operator=
              (this_01,(vector<long,_std::allocator<long>_> *)local_208);
    this = local_28;
    psVar3 = caffe::LayerParameter::top_abi_cxx11_((LayerParameter *)mapBlobNameToDimensions,0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,psVar3);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_208);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"WARNING: Skipping Data Layer \'");
    psVar3 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mapBlobNameToDimensions);
    poVar7 = std::operator<<(poVar7,(string *)psVar3);
    poVar7 = std::operator<<(poVar7,"\' of type \'");
    psVar3 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mapBlobNameToDimensions);
    poVar7 = std::operator<<(poVar7,(string *)psVar3);
    poVar7 = std::operator<<(poVar7,"\'. It is recommended to use Input layer for deployment.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void CoreMLConverter::convertCaffeInputLayers(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::vector<int64_t> >& mapBlobNameToDimensions = layerParameters.mapBlobNameToDimensions;
    std::set<std::string>& caffeNetworkInputNames = layerParameters.caffeNetworkInputNames;
    
    /*
     Mapping from Caffe Input Layer dimensions to CoreML Specification input dimensions:
     1-D (C) ----> (C)
     2-D : (Batch/Seq,C) ----> (C) [last dimension retained]
     >=3-D (...,C,H,W) ----> (C,H,W) [last 3 dimensions retained]
     */
    
    if (caffeLayer.type() == "Input"){
        if (caffeLayer.input_param().shape_size() == 0) {
            std::stringstream ss;
            ss << "Invalid caffe model: Input layer '" << caffeLayer.name() << "' does not specify the shape parameter." << std::endl;
            throw std::runtime_error(ss.str());
        }
        const ::caffe::BlobShape& shape = caffeLayer.input_param().shape(0);
        std::vector<int64_t> dims;
        if (shape.dim_size() == 0) {
            std::stringstream ss;
            ss << "Invalid caffe model: Input layer '" << caffeLayer.name() << "' does not specify dimensions." << std::endl;
            throw std::runtime_error(ss.str());
        }
        for (const auto& dim: shape.dim()) {
            assert(dim >= 0);
            dims.push_back(dim);
        }
        if (dims.size() == 2) {
            std::cout<<"Ignoring batch/seq size and retaining only the last dimension for conversion. " << std::endl;
            dims.erase(dims.begin(),dims.end()-1);
        }
        if (dims.size() > 3) {
            std::cout<<"Ignoring batch size and retaining only the trailing 3 dimensions for conversion. " << std::endl;
            dims.erase(dims.begin(),dims.end()-3);
        }
        
        
        if (caffeLayer.top_size() == 0) {
            CoreMLConverter::errorInCaffeProto("Caffe layer does not have a top blob ",caffeLayer.name(),caffeLayer.type());
        }
        mapBlobNameToDimensions[caffeLayer.top(0)] = dims;
        caffeNetworkInputNames.insert(caffeLayer.top(0));
    } else {
        std::cout<<"WARNING: Skipping Data Layer '"<< caffeLayer.name() << "' of type '" << caffeLayer.type() <<"'. It is recommended to use Input layer for deployment."
                <<std::endl;
    }
}